

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool __thiscall TestBranchInternal::Run(TestBranchInternal *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Outputter *pOVar2;
  stack<testinator::Branch_*,_std::deque<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>_>
  *psVar3;
  _Elt_pointer ppBVar4;
  Cons<std::pair<testinator::Nil,_const_char_*>_> *in_RDX;
  Cons<std::pair<std::pair<testinator::Nil,_const_char_*>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
  *t;
  Cons<std::pair<std::pair<testinator::Nil,_const_char_*>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
  *t_00;
  AtScopeExit<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_elbeno[P]testinator_src_test_main_cpp:404:5)>
  rspop404;
  BranchScope rs404;
  BranchScope rs399;
  AtScopeExit<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_elbeno[P]testinator_src_test_main_cpp:399:5)>
  rspop399;
  AtScopeExit<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_elbeno[P]testinator_src_test_main_cpp:404:5)>
  local_89;
  string local_88;
  undefined1 local_68 [24];
  BranchScope local_50;
  AtScopeExit<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_elbeno[P]testinator_src_test_main_cpp:399:5)>
  local_38 [8];
  char *local_30;
  string *local_28;
  
  pOVar2 = (this->super_Test).m_op;
  local_50.m_child = (Branch *)0x156732;
  testinator::Diagnostic<testinator::Cons<std::pair<testinator::Nil,char_const*>>>
            (&local_88,(testinator *)&local_50,in_RDX);
  (*pOVar2->_vptr_Outputter[3])(pOVar2,&local_88);
  paVar1 = &local_88.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  testinator::BranchScope::BranchScope
            (&local_50,399,
             "/workspace/llm4binary/github/license_c_cmakelists/elbeno[P]testinator/src/test/main.cpp"
             ,"A");
  if (local_50.m_canRun == true) {
    pOVar2 = (this->super_Test).m_op;
    psVar3 = testinator::Branch::getStack();
    ppBVar4 = (psVar3->c).
              super__Deque_base<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>._M_impl
              .super__Deque_impl_data._M_finish._M_cur;
    if (ppBVar4 ==
        (psVar3->c).super__Deque_base<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppBVar4 = (psVar3->c).
                super__Deque_base<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    local_68._16_8_ = &ppBVar4[-1]->m_name;
    local_68._8_8_ = "branch ";
    testinator::
    Diagnostic<testinator::Cons<std::pair<std::pair<testinator::Nil,char_const*>,std::__cxx11::string_const&>>>
              (&local_88,(testinator *)local_68,t);
    (*pOVar2->_vptr_Outputter[3])(pOVar2,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    testinator::
    AtScopeExit<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/elbeno[P]testinator/src/test/main.cpp:399:5)>
    ::~AtScopeExit(local_38);
  }
  testinator::BranchScope::BranchScope
            ((BranchScope *)local_68,0x194,
             "/workspace/llm4binary/github/license_c_cmakelists/elbeno[P]testinator/src/test/main.cpp"
             ,"B");
  if (local_68[0x10] == true) {
    pOVar2 = (this->super_Test).m_op;
    psVar3 = testinator::Branch::getStack();
    ppBVar4 = (psVar3->c).
              super__Deque_base<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>._M_impl
              .super__Deque_impl_data._M_finish._M_cur;
    if (ppBVar4 ==
        (psVar3->c).super__Deque_base<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppBVar4 = (psVar3->c).
                super__Deque_base<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    local_28 = &ppBVar4[-1]->m_name;
    local_30 = "branch ";
    testinator::
    Diagnostic<testinator::Cons<std::pair<std::pair<testinator::Nil,char_const*>,std::__cxx11::string_const&>>>
              (&local_88,(testinator *)local_38,t_00);
    (*pOVar2->_vptr_Outputter[3])(pOVar2,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    testinator::
    AtScopeExit<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/elbeno[P]testinator/src/test/main.cpp:404:5)>
    ::~AtScopeExit(&local_89);
  }
  *(bool *)local_68._0_8_ = (bool)(*(bool *)local_68._0_8_ & *(bool *)local_68._8_8_);
  *(bool *)(local_68._0_8_ + 1) = true;
  (local_50.m_parent)->m_complete =
       (bool)((local_50.m_parent)->m_complete & (local_50.m_child)->m_complete);
  (local_50.m_parent)->m_canRunChild = true;
  return true;
}

Assistant:

virtual bool Run()
  {
    DIAGNOSTIC("no branch");

    BRANCH(A)
    {
      DIAGNOSTIC("branch " << BRANCH_NAME);
    }

    BRANCH(B)
    {
      DIAGNOSTIC("branch " << BRANCH_NAME);
    }

    return true;
  }